

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_0::ProgramUniformCase::test(ProgramUniformCase *this)

{
  TestLog *log;
  char *__s;
  TestContext *pTVar1;
  GLuint GVar2;
  bool bVar3;
  ostream *poVar4;
  uint *puVar5;
  undefined1 local_b94 [8];
  StateQueryMemoryWriteGuard<unsigned_int> uniformIndex;
  char *uniformNames [1];
  char *fragmentSourceCStr;
  string fragmentSource;
  ostringstream frag;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_998;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_978;
  allocator<char> local_941;
  string local_940;
  ScopedLogSection local_920;
  int local_918;
  GLuint local_914;
  int ndx;
  GLuint program;
  GLuint shaderFrag;
  GLuint shaderVert;
  UniformType uniformTypes [41];
  ProgramUniformCase *this_local;
  
  uniformTypes[0x28]._48_8_ = this;
  memcpy(&shaderFrag,&DAT_032ad5c0,0x8f8);
  program = glu::CallLogWrapper::glCreateShader(&(this->super_ApiCase).super_CallLogWrapper,0x8b31);
  ndx = glu::CallLogWrapper::glCreateShader(&(this->super_ApiCase).super_CallLogWrapper,0x8b30);
  local_914 = glu::CallLogWrapper::glCreateProgram(&(this->super_ApiCase).super_CallLogWrapper);
  glu::CallLogWrapper::glAttachShader(&(this->super_ApiCase).super_CallLogWrapper,local_914,program)
  ;
  glu::CallLogWrapper::glAttachShader(&(this->super_ApiCase).super_CallLogWrapper,local_914,ndx);
  glu::CallLogWrapper::glShaderSource
            (&(this->super_ApiCase).super_CallLogWrapper,program,1,&test::vertSource,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader(&(this->super_ApiCase).super_CallLogWrapper,program);
  ApiCase::expectError(&this->super_ApiCase,0);
  for (local_918 = 0; local_918 < 0x29; local_918 = local_918 + 1) {
    log = (this->super_ApiCase).m_log;
    __s = *(char **)(&shaderFrag + (long)local_918 * 0xe);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_940,__s,&local_941);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_9d8,"Verify type of ",(allocator<char> *)&frag.field_0x177);
    std::operator+(&local_9b8,&local_9d8,*(char **)(&shaderFrag + (long)local_918 * 0xe));
    std::operator+(&local_998,&local_9b8," variable");
    std::operator+(&local_978,&local_998,uniformTypes[local_918].declaration);
    tcu::ScopedLogSection::ScopedLogSection(&local_920,log,&local_940,&local_978);
    tcu::ScopedLogSection::~ScopedLogSection(&local_920);
    std::__cxx11::string::~string((string *)&local_978);
    std::__cxx11::string::~string((string *)&local_998);
    std::__cxx11::string::~string((string *)&local_9b8);
    std::__cxx11::string::~string((string *)&local_9d8);
    std::allocator<char>::~allocator((allocator<char> *)&frag.field_0x177);
    std::__cxx11::string::~string((string *)&local_940);
    std::allocator<char>::~allocator(&local_941);
    std::__cxx11::ostringstream::ostringstream
              ((ostringstream *)(fragmentSource.field_2._M_local_buf + 8));
    std::operator<<((ostream *)(fragmentSource.field_2._M_local_buf + 8),"#version 300 es\n");
    poVar4 = std::operator<<((ostream *)((long)&fragmentSource.field_2 + 8),
                             uniformTypes[local_918].precision);
    poVar4 = std::operator<<(poVar4,"uniform ");
    poVar4 = std::operator<<(poVar4,uniformTypes[local_918].postDeclaration);
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = std::operator<<(poVar4,*(char **)(&shaderFrag + (long)local_918 * 0xe));
    poVar4 = std::operator<<(poVar4," uniformValue");
    poVar4 = std::operator<<(poVar4,uniformTypes[local_918].declaration);
    std::operator<<(poVar4,";\n");
    std::operator<<((ostream *)((long)&fragmentSource.field_2 + 8),
                    "layout(location = 0) out mediump vec4 fragColor;\n");
    std::operator<<((ostream *)((long)&fragmentSource.field_2 + 8),"void main (void)\n");
    std::operator<<((ostream *)((long)&fragmentSource.field_2 + 8),"{\n");
    poVar4 = std::operator<<((ostream *)((long)&fragmentSource.field_2 + 8),"\tfragColor = vec4(");
    poVar4 = std::operator<<(poVar4,uniformTypes[local_918].layout);
    std::operator<<(poVar4,");\n");
    std::operator<<((ostream *)((long)&fragmentSource.field_2 + 8),"}\n");
    std::__cxx11::ostringstream::str();
    uniformNames[0] = (char *)std::__cxx11::string::c_str();
    glu::CallLogWrapper::glShaderSource
              (&(this->super_ApiCase).super_CallLogWrapper,ndx,1,uniformNames,(GLint *)0x0);
    std::__cxx11::string::~string((string *)&fragmentSourceCStr);
    glu::CallLogWrapper::glCompileShader(&(this->super_ApiCase).super_CallLogWrapper,ndx);
    glu::CallLogWrapper::glLinkProgram(&(this->super_ApiCase).super_CallLogWrapper,local_914);
    bVar3 = verifyProgramParam((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.
                               m_testCtx,&(this->super_ApiCase).super_CallLogWrapper,local_914,
                               0x8b82,1);
    if (bVar3) {
      uniformIndex._4_8_ = (long)" uniformValue" + 1;
      deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_int>::
      StateQueryMemoryWriteGuard((StateQueryMemoryWriteGuard<unsigned_int> *)local_b94);
      GVar2 = local_914;
      puVar5 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_int>::operator&
                         ((StateQueryMemoryWriteGuard<unsigned_int> *)local_b94);
      glu::CallLogWrapper::glGetUniformIndices
                (&(this->super_ApiCase).super_CallLogWrapper,GVar2,1,
                 (GLchar **)&uniformIndex.m_value,puVar5);
      deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_int>::verifyValidity
                ((StateQueryMemoryWriteGuard<unsigned_int> *)local_b94,
                 (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
      GVar2 = local_914;
      pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
      puVar5 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_unsigned_int_
                         ((StateQueryMemoryWriteGuard *)local_b94);
      verifyActiveUniformParam
                (pTVar1,&(this->super_ApiCase).super_CallLogWrapper,GVar2,*puVar5,0x8a37,
                 *(GLenum *)&uniformTypes[local_918].getter);
      GVar2 = local_914;
      pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
      puVar5 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_unsigned_int_
                         ((StateQueryMemoryWriteGuard *)local_b94);
      verifyActiveUniformParam
                (pTVar1,&(this->super_ApiCase).super_CallLogWrapper,GVar2,*puVar5,0x8a38,
                 *(GLenum *)((long)&uniformTypes[local_918].getter + 4));
      GVar2 = local_914;
      pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
      puVar5 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_unsigned_int_
                         ((StateQueryMemoryWriteGuard *)local_b94);
      verifyActiveUniformParam
                (pTVar1,&(this->super_ApiCase).super_CallLogWrapper,GVar2,*puVar5,0x8a3e,
                 uniformTypes[local_918].type);
    }
    std::__cxx11::ostringstream::~ostringstream
              ((ostringstream *)(fragmentSource.field_2._M_local_buf + 8));
  }
  glu::CallLogWrapper::glDeleteShader(&(this->super_ApiCase).super_CallLogWrapper,program);
  glu::CallLogWrapper::glDeleteShader(&(this->super_ApiCase).super_CallLogWrapper,ndx);
  glu::CallLogWrapper::glDeleteProgram(&(this->super_ApiCase).super_CallLogWrapper,local_914);
  ApiCase::expectError(&this->super_ApiCase,0);
  return;
}

Assistant:

void test (void)
	{
		const struct UniformType
		{
			const char* declaration;
			const char* postDeclaration;
			const char* precision;
			const char* layout;
			const char* getter;
			GLenum		type;
			GLint		size;
			GLint		isRowMajor;
		} uniformTypes[] =
		{
			{ "float",					"",			"highp",	"",						"uniformValue",							GL_FLOAT,							1, GL_FALSE },
			{ "float[2]",				"",			"highp",	"",						"uniformValue[1]",						GL_FLOAT,							2, GL_FALSE },
			{ "vec2",					"",			"highp",	"",						"uniformValue.x",						GL_FLOAT_VEC2,						1, GL_FALSE },
			{ "vec3",					"",			"highp",	"",						"uniformValue.x",						GL_FLOAT_VEC3,						1, GL_FALSE },
			{ "vec4",					"",			"highp",	"",						"uniformValue.x",						GL_FLOAT_VEC4,						1, GL_FALSE },
			{ "int",					"",			"highp",	"",						"float(uniformValue)",					GL_INT,								1, GL_FALSE },
			{ "ivec2",					"",			"highp",	"",						"float(uniformValue.x)",				GL_INT_VEC2,						1, GL_FALSE },
			{ "ivec3",					"",			"highp",	"",						"float(uniformValue.x)",				GL_INT_VEC3,						1, GL_FALSE },
			{ "ivec4",					"",			"highp",	"",						"float(uniformValue.x)",				GL_INT_VEC4,						1, GL_FALSE },
			{ "uint",					"",			"highp",	"",						"float(uniformValue)",					GL_UNSIGNED_INT,					1, GL_FALSE },
			{ "uvec2",					"",			"highp",	"",						"float(uniformValue.x)",				GL_UNSIGNED_INT_VEC2,				1, GL_FALSE },
			{ "uvec3",					"",			"highp",	"",						"float(uniformValue.x)",				GL_UNSIGNED_INT_VEC3,				1, GL_FALSE },
			{ "uvec4",					"",			"highp",	"",						"float(uniformValue.x)",				GL_UNSIGNED_INT_VEC4,				1, GL_FALSE },
			{ "bool",					"",			"",			"",						"float(uniformValue)",					GL_BOOL,							1, GL_FALSE },
			{ "bvec2",					"",			"",			"",						"float(uniformValue.x)",				GL_BOOL_VEC2,						1, GL_FALSE },
			{ "bvec3",					"",			"",			"",						"float(uniformValue.x)",				GL_BOOL_VEC3,						1, GL_FALSE },
			{ "bvec4",					"",			"",			"",						"float(uniformValue.x)",				GL_BOOL_VEC4,						1, GL_FALSE },
			{ "mat2",					"",			"highp",	"",						"float(uniformValue[0][0])",			GL_FLOAT_MAT2,						1, GL_FALSE },
			{ "mat3",					"",			"highp",	"",						"float(uniformValue[0][0])",			GL_FLOAT_MAT3,						1, GL_FALSE },
			{ "mat4",					"",			"highp",	"",						"float(uniformValue[0][0])",			GL_FLOAT_MAT4,						1, GL_FALSE },
			{ "mat2x3",					"",			"highp",	"",						"float(uniformValue[0][0])",			GL_FLOAT_MAT2x3,					1, GL_FALSE },
			{ "mat2x4",					"",			"highp",	"",						"float(uniformValue[0][0])",			GL_FLOAT_MAT2x4,					1, GL_FALSE },
			{ "mat3x2",					"",			"highp",	"",						"float(uniformValue[0][0])",			GL_FLOAT_MAT3x2,					1, GL_FALSE },
			{ "mat3x4",					"",			"highp",	"",						"float(uniformValue[0][0])",			GL_FLOAT_MAT3x4,					1, GL_FALSE },
			{ "mat4x2",					"",			"highp",	"",						"float(uniformValue[0][0])",			GL_FLOAT_MAT4x2,					1, GL_FALSE },
			{ "mat4x3",					"",			"highp",	"",						"float(uniformValue[0][0])",			GL_FLOAT_MAT4x3,					1, GL_FALSE },
			{ "sampler2D",				"",			"highp",	"",						"float(textureSize(uniformValue,0).r)",	GL_SAMPLER_2D,						1, GL_FALSE },
			{ "sampler3D",				"",			"highp",	"",						"float(textureSize(uniformValue,0).r)",	GL_SAMPLER_3D,						1, GL_FALSE },
			{ "samplerCube",			"",			"highp",	"",						"float(textureSize(uniformValue,0).r)",	GL_SAMPLER_CUBE,					1, GL_FALSE },
			{ "sampler2DShadow",		"",			"highp",	"",						"float(textureSize(uniformValue,0).r)",	GL_SAMPLER_2D_SHADOW,				1, GL_FALSE },
			{ "sampler2DArray",			"",			"highp",	"",						"float(textureSize(uniformValue,0).r)",	GL_SAMPLER_2D_ARRAY,				1, GL_FALSE },
			{ "sampler2DArrayShadow",	"",			"highp",	"",						"float(textureSize(uniformValue,0).r)",	GL_SAMPLER_2D_ARRAY_SHADOW,			1, GL_FALSE },
			{ "samplerCubeShadow",		"",			"highp",	"",						"float(textureSize(uniformValue,0).r)",	GL_SAMPLER_CUBE_SHADOW,				1, GL_FALSE },
			{ "isampler2D",				"",			"highp",	"",						"float(textureSize(uniformValue,0).r)",	GL_INT_SAMPLER_2D,					1, GL_FALSE },
			{ "isampler3D",				"",			"highp",	"",						"float(textureSize(uniformValue,0).r)",	GL_INT_SAMPLER_3D,					1, GL_FALSE },
			{ "isamplerCube",			"",			"highp",	"",						"float(textureSize(uniformValue,0).r)",	GL_INT_SAMPLER_CUBE,				1, GL_FALSE },
			{ "isampler2DArray",		"",			"highp",	"",						"float(textureSize(uniformValue,0).r)",	GL_INT_SAMPLER_2D_ARRAY,			1, GL_FALSE },
			{ "usampler2D",				"",			"highp",	"",						"float(textureSize(uniformValue,0).r)",	GL_UNSIGNED_INT_SAMPLER_2D,			1, GL_FALSE },
			{ "usampler3D",				"",			"highp",	"",						"float(textureSize(uniformValue,0).r)",	GL_UNSIGNED_INT_SAMPLER_3D,			1, GL_FALSE },
			{ "usamplerCube",			"",			"highp",	"",						"float(textureSize(uniformValue,0).r)",	GL_UNSIGNED_INT_SAMPLER_CUBE,		1, GL_FALSE },
			{ "usampler2DArray",		"",			"highp",	"",						"float(textureSize(uniformValue,0).r)",	GL_UNSIGNED_INT_SAMPLER_2D_ARRAY,	1, GL_FALSE },
		};

		static const char* vertSource =
			"#version 300 es\n"
			"void main (void)\n"
			"{\n"
			"	gl_Position = vec4(0.0);\n"
			"}\n\0";

		GLuint shaderVert	= glCreateShader(GL_VERTEX_SHADER);
		GLuint shaderFrag	= glCreateShader(GL_FRAGMENT_SHADER);
		GLuint program		= glCreateProgram();

		glAttachShader(program, shaderVert);
		glAttachShader(program, shaderFrag);

		glShaderSource(shaderVert, 1, &vertSource, DE_NULL);
		glCompileShader(shaderVert);
		expectError(GL_NO_ERROR);

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(uniformTypes); ++ndx)
		{
			tcu::ScopedLogSection(m_log, uniformTypes[ndx].declaration, std::string("Verify type of ") + uniformTypes[ndx].declaration + " variable" + uniformTypes[ndx].postDeclaration );

			// gen fragment shader

			std::ostringstream frag;
			frag << "#version 300 es\n";
			frag << uniformTypes[ndx].layout << "uniform " << uniformTypes[ndx].precision << " " << uniformTypes[ndx].declaration << " uniformValue" << uniformTypes[ndx].postDeclaration << ";\n";
			frag << "layout(location = 0) out mediump vec4 fragColor;\n";
			frag << "void main (void)\n";
			frag << "{\n";
			frag << "	fragColor = vec4(" << uniformTypes[ndx].getter << ");\n";
			frag << "}\n";

			{
				std::string fragmentSource = frag.str();
				const char* fragmentSourceCStr = fragmentSource.c_str();
				glShaderSource(shaderFrag, 1, &fragmentSourceCStr, DE_NULL);
			}

			// compile & link

			glCompileShader(shaderFrag);
			glLinkProgram(program);

			// test
			if (verifyProgramParam(m_testCtx, *this, program, GL_LINK_STATUS, GL_TRUE))
			{
				const char* uniformNames[] = {"uniformValue"};
				StateQueryMemoryWriteGuard<GLuint> uniformIndex;
				glGetUniformIndices(program, 1, uniformNames, &uniformIndex);
				uniformIndex.verifyValidity(m_testCtx);

				verifyActiveUniformParam(m_testCtx, *this, program, uniformIndex, GL_UNIFORM_TYPE,			uniformTypes[ndx].type);
				verifyActiveUniformParam(m_testCtx, *this, program, uniformIndex, GL_UNIFORM_SIZE,			uniformTypes[ndx].size);
				verifyActiveUniformParam(m_testCtx, *this, program, uniformIndex, GL_UNIFORM_IS_ROW_MAJOR,	uniformTypes[ndx].isRowMajor);
			}
		}

		glDeleteShader(shaderVert);
		glDeleteShader(shaderFrag);
		glDeleteProgram(program);
		expectError(GL_NO_ERROR);
	}